

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O3

void sei_encode_eia608(sei_t *sei,cea708_t *cea708,uint16_t cc_data)

{
  uint16_t uVar1;
  uint uVar2;
  
  uVar2 = *(uint *)&cea708->user_data;
  if ((~uVar2 & 0xf8) == 0) {
    sei_append_708(sei,cea708);
    uVar2 = (uint)*(ushort *)&cea708->user_data;
  }
  if ((uVar2 & 0xf8) == 0) {
    uVar1 = eia608_control_command(eia608_control_resume_caption_loading,0);
    cea708_add_cc_data(cea708,1,cc_type_ntsc_cc_field_1,uVar1);
    uVar1 = eia608_control_command(eia608_control_resume_caption_loading,0);
    cea708_add_cc_data(cea708,1,cc_type_ntsc_cc_field_1,uVar1);
  }
  if (cc_data != 0) {
    cea708_add_cc_data(cea708,1,cc_type_ntsc_cc_field_1,cc_data);
    return;
  }
  uVar1 = eia608_control_command(eia608_control_end_of_caption,0);
  sei_encode_eia608(sei,cea708,uVar1);
  uVar1 = eia608_control_command(eia608_control_end_of_caption,0);
  sei_encode_eia608(sei,cea708,uVar1);
  sei_append_708(sei,cea708);
  return;
}

Assistant:

void sei_encode_eia608(sei_t* sei, cea708_t* cea708, uint16_t cc_data)
{
    // This one is full, flush and init a new one
    // shoudl this be 32? I cant remember
    if (31 == cea708->user_data.cc_count) {
        sei_append_708(sei, cea708);
    }

    if (0 == cea708->user_data.cc_count) { // This is a new 708 header, but a continuation of a 608 stream
        cea708_add_cc_data(cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_resume_caption_loading, DEFAULT_CHANNEL));
        cea708_add_cc_data(cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_resume_caption_loading, DEFAULT_CHANNEL));
    }

    if (0 == cc_data) { // Finished
        sei_encode_eia608(sei, cea708, eia608_control_command(eia608_control_end_of_caption, DEFAULT_CHANNEL));
        sei_encode_eia608(sei, cea708, eia608_control_command(eia608_control_end_of_caption, DEFAULT_CHANNEL));
        sei_append_708(sei, cea708);
        return;
    }

    cea708_add_cc_data(cea708, 1, cc_type_ntsc_cc_field_1, cc_data);
}